

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O3

void free_host(LIBSSH2_SESSION *session,known_host *entry)

{
  if (entry != (known_host *)0x0) {
    if (entry->comment != (char *)0x0) {
      (*session->free)(entry->comment,&session->abstract);
    }
    if (entry->key_type_name != (char *)0x0) {
      (*session->free)(entry->key_type_name,&session->abstract);
    }
    if (entry->key != (char *)0x0) {
      (*session->free)(entry->key,&session->abstract);
    }
    if (entry->salt != (char *)0x0) {
      (*session->free)(entry->salt,&session->abstract);
    }
    if (entry->name != (char *)0x0) {
      (*session->free)(entry->name,&session->abstract);
    }
    (*session->free)(entry,&session->abstract);
    return;
  }
  return;
}

Assistant:

static void free_host(LIBSSH2_SESSION *session, struct known_host *entry)
{
    if(entry) {
        if(entry->comment)
            LIBSSH2_FREE(session, entry->comment);
        if(entry->key_type_name)
            LIBSSH2_FREE(session, entry->key_type_name);
        if(entry->key)
            LIBSSH2_FREE(session, entry->key);
        if(entry->salt)
            LIBSSH2_FREE(session, entry->salt);
        if(entry->name)
            LIBSSH2_FREE(session, entry->name);
        LIBSSH2_FREE(session, entry);
    }
}